

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compoundfile_stream_and_dir.hpp
# Opt level: O0

char __thiscall CompoundFile::Stream::getByte(Stream *this)

{
  reference pvVar1;
  vector<char,_std::allocator<char>_> *in_RDI;
  value_type ch;
  Stream *in_stack_00000030;
  size_type in_stack_ffffffffffffffd8;
  char local_1;
  
  if (*(int *)&in_RDI[4].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 <
      *(int *)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0xc) {
    local_1 = -1;
  }
  else {
    if (*(int *)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14 ==
        *(int *)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10) {
      *(undefined4 *)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14 =
           0;
      seekToNextSector(in_stack_00000030);
    }
    pvVar1 = std::vector<char,_std::allocator<char>_>::at(in_RDI,in_stack_ffffffffffffffd8);
    local_1 = *pvVar1;
    *(int *)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14 =
         *(int *)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x14 + 1;
    *(int *)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0xc =
         *(int *)&in_RDI[3].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0xc + 1;
    *(int *)&in_RDI[5].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 =
         *(int *)&in_RDI[5].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 + 1;
  }
  return local_1;
}

Assistant:

inline char
Stream::getByte()
{
	if( m_bytesReaded > m_streamSize )
		return 0xFFu;

	if( m_sectorBytesReaded == m_sectorSize )
	{
		m_sectorBytesReaded = 0;

		seekToNextSector();
	}

	const auto ch = m_buf.at( m_pos );

	++m_sectorBytesReaded;
	++m_bytesReaded;
	++m_pos;

	return ch;
}